

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_fillreadbuffer(connectdata *conn,size_t bytes,size_t *nreadp)

{
  bool bVar1;
  undefined8 __src;
  int iVar2;
  Curl_send_buffer *pCVar3;
  curl_read_callback __dest;
  size_t sVar4;
  size_t sVar5;
  char local_8b [8];
  char hexbuffer [11];
  char *endofline_network;
  char *endofline_native;
  int hexlen;
  _Bool added_crlf;
  SingleRequest *k;
  int trailers_ret_code;
  CURLcode result;
  curl_slist *trailers;
  void *extra_data;
  curl_read_callback readfunc;
  size_t nread;
  size_t buffersize;
  Curl_easy *data;
  size_t *nreadp_local;
  size_t bytes_local;
  connectdata *conn_local;
  
  buffersize = (size_t)conn->data;
  extra_data = (void *)0x0;
  trailers = (curl_slist *)0x0;
  nread = bytes;
  data = (Curl_easy *)nreadp;
  nreadp_local = (size_t *)bytes;
  bytes_local = (size_t)conn;
  if ((((Curl_easy *)buffersize)->state).trailers_state == TRAILERS_INITIALIZED) {
    _trailers_ret_code = (curl_slist *)0x0;
    Curl_infof((Curl_easy *)buffersize,
               "Moving trailers state machine from initialized to sending.\n");
    *(undefined4 *)(buffersize + 0x1608) = 2;
    pCVar3 = Curl_add_buffer_init();
    *(Curl_send_buffer **)(buffersize + 0x1600) = pCVar3;
    if (*(long *)(buffersize + 0x1600) == 0) {
      Curl_failf((Curl_easy *)buffersize,"Unable to allocate trailing headers buffer !");
      return CURLE_OUT_OF_MEMORY;
    }
    *(undefined8 *)(buffersize + 0x15f8) = 0;
    Curl_set_in_callback((Curl_easy *)buffersize,true);
    iVar2 = (**(code **)(buffersize + 0xf30))(&trailers_ret_code);
    Curl_set_in_callback((Curl_easy *)buffersize,false);
    if (iVar2 == 0) {
      k._4_4_ = Curl_http_compile_trailers
                          (_trailers_ret_code,(Curl_send_buffer **)(buffersize + 0x1600),
                           (Curl_easy *)buffersize);
    }
    else {
      Curl_failf((Curl_easy *)buffersize,"operation aborted by trailing headers callback");
      data->next = (Curl_easy *)0x0;
      k._4_4_ = CURLE_ABORTED_BY_CALLBACK;
    }
    if (k._4_4_ != CURLE_OK) {
      Curl_add_buffer_free((Curl_send_buffer **)(buffersize + 0x1600));
      curl_slist_free_all(_trailers_ret_code);
      return k._4_4_;
    }
    Curl_infof((Curl_easy *)buffersize,"Successfully compiled trailers.\r\n");
    curl_slist_free_all(_trailers_ret_code);
  }
  if (((*(ushort *)(buffersize + 0x648) >> 6 & 1) != 0) && (*(int *)(buffersize + 0x1608) == 0)) {
    nread = nread - 0xc;
    *(long *)(buffersize + 0x1c8) = *(long *)(buffersize + 0x1c8) + 10;
  }
  if (*(int *)(buffersize + 0x1608) == 2) {
    extra_data = Curl_trailers_read;
    trailers = (curl_slist *)buffersize;
  }
  else {
    extra_data = *(void **)(buffersize + 0x1590);
    trailers = *(curl_slist **)(buffersize + 0x1598);
  }
  Curl_set_in_callback((Curl_easy *)buffersize,true);
  readfunc = (curl_read_callback)
             (*(code *)extra_data)(*(undefined8 *)(buffersize + 0x1c8),1,nread,trailers);
  Curl_set_in_callback((Curl_easy *)buffersize,false);
  if (readfunc == (curl_read_callback)0x10000000) {
    Curl_failf((Curl_easy *)buffersize,"operation aborted by callback");
    data->next = (Curl_easy *)0x0;
    conn_local._4_4_ = CURLE_ABORTED_BY_CALLBACK;
  }
  else if (readfunc == (curl_read_callback)0x10000001) {
    if ((*(uint *)(*(long *)(bytes_local + 0x648) + 0x84) & 0x10) == 0) {
      *(uint *)(buffersize + 0x1a8) = *(uint *)(buffersize + 0x1a8) | 0x20;
      if ((*(ushort *)(buffersize + 0x648) >> 6 & 1) != 0) {
        *(long *)(buffersize + 0x1c8) = *(long *)(buffersize + 0x1c8) + -10;
      }
      data->next = (Curl_easy *)0x0;
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf((Curl_easy *)buffersize,"Read callback asked for PAUSE when not supported!");
      conn_local._4_4_ = CURLE_READ_ERROR;
    }
  }
  else if (nread < readfunc) {
    data->next = (Curl_easy *)0x0;
    Curl_failf((Curl_easy *)buffersize,"read function returned funny value");
    conn_local._4_4_ = CURLE_READ_ERROR;
  }
  else {
    if (((*(ushort *)(buffersize + 0x648) >> 8 & 1) == 0) &&
       ((*(ushort *)(buffersize + 0x648) >> 6 & 1) != 0)) {
      bVar1 = false;
      endofline_native._0_4_ = 0;
      if (((*(ulong *)(buffersize + 0xf38) >> 0xb & 1) == 0) &&
         ((*(ulong *)(buffersize + 0xf38) >> 6 & 1) == 0)) {
        endofline_network = "\r\n";
        hexbuffer._3_8_ = (long)"Content-Length: 0\r\n\r\n" + 0x13;
      }
      else {
        endofline_network = "\n";
        hexbuffer._3_8_ = (long)" \t\n" + 2;
      }
      if (*(int *)(buffersize + 0x1608) != 2) {
        memset(local_8b,0,0xb);
        endofline_native._0_4_ = curl_msnprintf(local_8b,0xb,"%zx%s",readfunc,endofline_network);
        *(long *)(buffersize + 0x1c8) = *(long *)(buffersize + 0x1c8) - (long)(int)endofline_native;
        readfunc = readfunc + (int)endofline_native;
        memcpy(*(void **)(buffersize + 0x1c8),local_8b,(long)(int)endofline_native);
        __src = hexbuffer._3_8_;
        if (((readfunc == (curl_read_callback)(long)(int)endofline_native) &&
            (*(long *)(buffersize + 0xf30) != 0)) && (*(int *)(buffersize + 0x1608) == 0)) {
          *(undefined4 *)(buffersize + 0x1608) = 1;
        }
        else {
          __dest = readfunc + *(long *)(buffersize + 0x1c8);
          sVar5 = strlen((char *)hexbuffer._3_8_);
          memcpy(__dest,(void *)__src,sVar5);
          bVar1 = true;
        }
      }
      if ((*(int *)(buffersize + 0x1608) == 2) &&
         (sVar4 = Curl_trailers_left((void *)buffersize), sVar4 == 0)) {
        Curl_add_buffer_free((Curl_send_buffer **)(buffersize + 0x1600));
        *(undefined4 *)(buffersize + 0x1608) = 3;
        *(undefined8 *)(buffersize + 0xf28) = 0;
        *(undefined8 *)(buffersize + 0xf30) = 0;
        *(ushort *)(buffersize + 0x648) = *(ushort *)(buffersize + 0x648) & 0xfffb | 4;
        Curl_infof((Curl_easy *)buffersize,"Signaling end of chunked upload after trailers.\n");
      }
      else if ((readfunc == (curl_read_callback)(long)(int)endofline_native) &&
              (*(int *)(buffersize + 0x1608) != 1)) {
        *(ushort *)(buffersize + 0x648) = *(ushort *)(buffersize + 0x648) & 0xfffb | 4;
        Curl_infof((Curl_easy *)buffersize,
                   "Signaling end of chunked upload via terminating chunk.\n");
      }
      if (bVar1) {
        sVar5 = strlen((char *)hexbuffer._3_8_);
        readfunc = readfunc + sVar5;
      }
    }
    data->next = (Curl_easy *)readfunc;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_fillreadbuffer(struct connectdata *conn, size_t bytes,
                             size_t *nreadp)
{
  struct Curl_easy *data = conn->data;
  size_t buffersize = bytes;
  size_t nread;

  curl_read_callback readfunc = NULL;
  void *extra_data = NULL;

#ifdef CURL_DOES_CONVERSIONS
  bool sending_http_headers = FALSE;

  if(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)) {
    const struct HTTP *http = data->req.protop;

    if(http->sending == HTTPSEND_REQUEST)
      /* We're sending the HTTP request headers, not the data.
         Remember that so we don't re-translate them into garbage. */
      sending_http_headers = TRUE;
  }
#endif

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_INITIALIZED) {
    struct curl_slist *trailers = NULL;
    CURLcode result;
    int trailers_ret_code;

    /* at this point we already verified that the callback exists
       so we compile and store the trailers buffer, then proceed */
    infof(data,
          "Moving trailers state machine from initialized to sending.\n");
    data->state.trailers_state = TRAILERS_SENDING;
    data->state.trailers_buf = Curl_add_buffer_init();
    if(!data->state.trailers_buf) {
      failf(data, "Unable to allocate trailing headers buffer !");
      return CURLE_OUT_OF_MEMORY;
    }
    data->state.trailers_bytes_sent = 0;
    Curl_set_in_callback(data, true);
    trailers_ret_code = data->set.trailer_callback(&trailers,
                                                   data->set.trailer_data);
    Curl_set_in_callback(data, false);
    if(trailers_ret_code == CURL_TRAILERFUNC_OK) {
      result = Curl_http_compile_trailers(trailers, &data->state.trailers_buf,
                                          data);
    }
    else {
      failf(data, "operation aborted by trailing headers callback");
      *nreadp = 0;
      result = CURLE_ABORTED_BY_CALLBACK;
    }
    if(result) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      curl_slist_free_all(trailers);
      return result;
    }
    infof(data, "Successfully compiled trailers.\r\n");
    curl_slist_free_all(trailers);
  }
#endif

  /* if we are transmitting trailing data, we don't need to write
     a chunk size so we skip this */
  if(data->req.upload_chunky &&
     data->state.trailers_state == TRAILERS_NONE) {
    /* if chunked Transfer-Encoding */
    buffersize -= (8 + 2 + 2);   /* 32bit hex + CRLF + CRLF */
    data->req.upload_fromhere += (8 + 2); /* 32bit hex + CRLF */
  }

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_SENDING) {
    /* if we're here then that means that we already sent the last empty chunk
       but we didn't send a final CR LF, so we sent 0 CR LF. We then start
       pulling trailing data until we have no more at which point we
       simply return to the previous point in the state machine as if
       nothing happened.
       */
    readfunc = Curl_trailers_read;
    extra_data = (void *)data;
  }
  else
#endif
  {
    readfunc = data->state.fread_func;
    extra_data = data->state.in;
  }

  Curl_set_in_callback(data, true);
  nread = readfunc(data->req.upload_fromhere, 1,
                   buffersize, extra_data);
  Curl_set_in_callback(data, false);

  if(nread == CURL_READFUNC_ABORT) {
    failf(data, "operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if(nread == CURL_READFUNC_PAUSE) {
    struct SingleRequest *k = &data->req;

    if(conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it can't pause since the transfer
         isn't done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported!");
      return CURLE_READ_ERROR;
    }

    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    k->keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    if(data->req.upload_chunky) {
        /* Back out the preallocation done above */
      data->req.upload_fromhere -= (8 + 2);
    }
    *nreadp = 0;

    return CURLE_OK; /* nothing was read */
  }
  else if(nread > buffersize) {
    /* the read function returned a too large value */
    *nreadp = 0;
    failf(data, "read function returned funny value");
    return CURLE_READ_ERROR;
  }

  if(!data->req.forbidchunk && data->req.upload_chunky) {
    /* if chunked Transfer-Encoding
     *    build chunk:
     *
     *        <HEX SIZE> CRLF
     *        <DATA> CRLF
     */
    /* On non-ASCII platforms the <DATA> may or may not be
       translated based on set.prefer_ascii while the protocol
       portion must always be translated to the network encoding.
       To further complicate matters, line end conversion might be
       done later on, so we need to prevent CRLFs from becoming
       CRCRLFs if that's the case.  To do this we use bare LFs
       here, knowing they'll become CRLFs later on.
     */

    bool added_crlf = FALSE;
    int hexlen = 0;
    const char *endofline_native;
    const char *endofline_network;

    if(
#ifdef CURL_DO_LINEEND_CONV
       (data->set.prefer_ascii) ||
#endif
       (data->set.crlf)) {
      /* \n will become \r\n later on */
      endofline_native  = "\n";
      endofline_network = "\x0a";
    }
    else {
      endofline_native  = "\r\n";
      endofline_network = "\x0d\x0a";
    }

    /* if we're not handling trailing data, proceed as usual */
    if(data->state.trailers_state != TRAILERS_SENDING) {
      char hexbuffer[11] = "";
      hexlen = msnprintf(hexbuffer, sizeof(hexbuffer),
                         "%zx%s", nread, endofline_native);

      /* move buffer pointer */
      data->req.upload_fromhere -= hexlen;
      nread += hexlen;

      /* copy the prefix to the buffer, leaving out the NUL */
      memcpy(data->req.upload_fromhere, hexbuffer, hexlen);

      /* always append ASCII CRLF to the data unless
         we have a valid trailer callback */
#ifndef CURL_DISABLE_HTTP
      if((nread-hexlen) == 0 &&
          data->set.trailer_callback != NULL &&
          data->state.trailers_state == TRAILERS_NONE) {
        data->state.trailers_state = TRAILERS_INITIALIZED;
      }
      else
#endif
      {
        memcpy(data->req.upload_fromhere + nread,
               endofline_network,
               strlen(endofline_network));
        added_crlf = TRUE;
      }
    }

#ifdef CURL_DOES_CONVERSIONS
    {
      CURLcode result;
      size_t length;
      if(data->set.prefer_ascii)
        /* translate the protocol and data */
        length = nread;
      else
        /* just translate the protocol portion */
        length = hexlen;
      if(length) {
        result = Curl_convert_to_network(data, data->req.upload_fromhere,
                                         length);
        /* Curl_convert_to_network calls failf if unsuccessful */
        if(result)
          return result;
      }
    }
#endif /* CURL_DOES_CONVERSIONS */

#ifndef CURL_DISABLE_HTTP
    if(data->state.trailers_state == TRAILERS_SENDING &&
       !Curl_trailers_left(data)) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      data->state.trailers_state = TRAILERS_DONE;
      data->set.trailer_data = NULL;
      data->set.trailer_callback = NULL;
      /* mark the transfer as done */
      data->req.upload_done = TRUE;
      infof(data, "Signaling end of chunked upload after trailers.\n");
    }
    else
#endif
      if((nread - hexlen) == 0 &&
         data->state.trailers_state != TRAILERS_INITIALIZED) {
        /* mark this as done once this chunk is transferred */
        data->req.upload_done = TRUE;
        infof(data,
              "Signaling end of chunked upload via terminating chunk.\n");
      }

    if(added_crlf)
      nread += strlen(endofline_network); /* for the added end of line */
  }
#ifdef CURL_DOES_CONVERSIONS
  else if((data->set.prefer_ascii) && (!sending_http_headers)) {
    CURLcode result;
    result = Curl_convert_to_network(data, data->req.upload_fromhere, nread);
    /* Curl_convert_to_network calls failf if unsuccessful */
    if(result)
      return result;
  }
#endif /* CURL_DOES_CONVERSIONS */

  *nreadp = nread;

  return CURLE_OK;
}